

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  size_t sVar3;
  TimeInMillis ms;
  TimeInMillis ms_00;
  _Alloc_hider _Var4;
  char *pcVar5;
  undefined1 local_98 [8];
  string kTestsuite;
  int local_54;
  string local_50;
  
  local_98 = (undefined1  [8])&kTestsuite._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"testcase","");
  if (test_info->is_in_another_shard_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase",0xd);
    kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)((long)&kTestsuite.field_2 + 8),"name","");
    std::__cxx11::string::string
              ((string *)&local_50,(test_info->name_)._M_dataplus._M_p,(allocator *)&local_54);
    OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),&local_50
                      );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
      operator_delete((void *)kTestsuite.field_2._8_8_);
    }
    pbVar1 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"value_param","");
      pbVar1 = (test_info->value_param_)._M_t.
               super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
      if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        _Var4._M_p = (char *)0x0;
      }
      else {
        _Var4._M_p = (pbVar1->_M_dataplus)._M_p;
      }
      std::__cxx11::string::string((string *)&local_50,_Var4._M_p,(allocator *)&local_54);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
    }
    pbVar1 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if ((pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
       ((pbVar1->_M_dataplus)._M_p != (pointer)0x0)) {
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"type_param","");
      pbVar1 = (test_info->type_param_)._M_t.
               super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
      if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        _Var4._M_p = (char *)0x0;
      }
      else {
        _Var4._M_p = (pbVar1->_M_dataplus)._M_p;
      }
      std::__cxx11::string::string((string *)&local_50,_Var4._M_p,(allocator *)&local_54);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
    }
    if (FLAGS_gtest_list_tests == '\x01') {
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"file","");
      std::__cxx11::string::string
                ((string *)&local_50,(test_info->location_).file._M_dataplus._M_p,
                 (allocator *)&local_54);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"line","");
      local_54 = (test_info->location_).line;
      StreamableToString<int>(&local_50,&local_54);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      std::__ostream_insert<char,std::char_traits<char>>(stream," />\n",4);
    }
    else {
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"status","");
      pcVar5 = "notrun";
      if ((ulong)test_info->should_run_ != 0) {
        pcVar5 = "run";
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar5,pcVar5 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"result","");
      if (test_info->should_run_ == true) {
        bVar2 = TestResult::Skipped(&test_info->result_);
        pcVar5 = "completed";
        if (bVar2) {
          pcVar5 = "skipped";
        }
      }
      else {
        pcVar5 = "suppressed";
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      sVar3 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,pcVar5,pcVar5 + sVar3);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"time","");
      FormatTimeInMillisAsSeconds_abi_cxx11_
                (&local_50,(internal *)(test_info->result_).elapsed_time_,ms);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"timestamp","");
      FormatEpochTimeInMillisAsIso8601_abi_cxx11_
                (&local_50,(internal *)(test_info->result_).start_timestamp_,ms_00);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      kTestsuite.field_2._8_8_ = &stack0xffffffffffffff98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&kTestsuite.field_2 + 8),"classname","");
      std::__cxx11::string::string((string *)&local_50,test_suite_name,(allocator *)&local_54);
      OutputXmlAttribute(stream,(string *)local_98,(string *)((long)&kTestsuite.field_2 + 8),
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)kTestsuite.field_2._8_8_ != &stack0xffffffffffffff98) {
        operator_delete((void *)kTestsuite.field_2._8_8_);
      }
      OutputXmlTestResult(stream,&test_info->result_);
    }
  }
  if (local_98 != (undefined1  [8])&kTestsuite._M_string_length) {
    operator_delete((void *)local_98);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  OutputXmlTestResult(stream, result);
}